

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O1

void __thiscall RealTransport::test_method(RealTransport *this)

{
  bool bVar1;
  Index outer_stride;
  undefined **ppuVar2;
  undefined8 *puVar3;
  char *__function;
  MatrixXd Hout;
  VectorXd x;
  VectorXd v;
  MatrixXd H;
  MatrixXd expectedRes;
  RealSpace Space;
  Matrix<double,__1,__1,_0,__1,__1> local_308;
  undefined **local_2e8;
  void *pvStack_2e0;
  shared_count local_2d8;
  void *local_2d0;
  undefined8 uStack_2c8;
  undefined **local_2b8;
  void *local_2b0;
  undefined **local_2a8;
  void *local_2a0;
  void *local_298;
  long local_290;
  long local_288;
  Matrix<double,__1,__1,_0,__1,__1> local_280;
  undefined **local_268;
  char *pcStack_260;
  void *local_250;
  undefined8 uStack_248;
  double *local_238;
  undefined **ppuStack_230;
  ulong local_228;
  undefined **ppuStack_220;
  undefined **local_208;
  void *pvStack_200;
  RealScalar local_1f0;
  undefined **local_1e8;
  void *pvStack_1e0;
  undefined8 *local_1d8;
  undefined ***local_1d0;
  undefined8 uStack_1c8;
  void *local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  code *local_90 [11];
  void *local_38;
  void *local_28;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_90,7);
  ppuVar2 = (undefined **)mnf::Manifold::dim();
  pvStack_1e0 = (void *)0x5;
  local_1e8 = ppuVar2;
  if ((long)ppuVar2 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_298,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_1e8);
  local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  if (0x1999999999999999 < (long)ppuVar2) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = std::ostream::_M_insert<long>;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if ((long)ppuVar2 * -5 != 0) {
    free((void *)0x0);
    if (ppuVar2 == (undefined **)0x0) {
      local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
    }
    else {
      local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           Eigen::internal::conditional_aligned_new_auto<double,true>((long)ppuVar2 * 5);
    }
  }
  local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 5;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)ppuVar2;
  local_1e8 = ppuVar2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_2a8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_1e8);
  mnf::Manifold::getZero();
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_2b8,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&local_2e8);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_1d0);
  free(pvStack_1e0);
  local_208 = local_2b8;
  pvStack_200 = local_2b0;
  if ((long)local_2b0 < 0 && local_2b8 != (undefined **)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
    ;
  }
  else {
    local_1d0 = (undefined ***)0x0;
    uStack_1c8 = 0;
    local_1e8 = local_2b8;
    pvStack_1e0 = local_2b0;
    local_2d0 = (void *)0x0;
    uStack_2c8 = 0;
    local_2e8 = local_2a8;
    pvStack_2e0 = local_2a0;
    if (-1 < (long)local_2a0 || local_2a8 == (undefined **)0x0) {
      mnf::Manifold::retractation(local_90,&local_208,&local_1e8,&local_2e8);
      free(local_2d0);
      free(local_1d0);
      local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           Eigen::internal::conditional_aligned_new_auto<double,true>(local_288 * local_290);
      local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           local_290;
      local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           local_288;
      if (local_288 * local_290 != 0) {
        memcpy(local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data,local_298,local_288 * local_290 * 8);
      }
      ppuStack_220 = (undefined **)0x0;
      local_238 = local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
      ppuStack_230 = (undefined **)
                     local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
      local_228 = local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols;
      if ((local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols | local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows) < 0 &&
          local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data != (double *)0x0) {
        __function = 
        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1>>, Level = 0]"
        ;
        goto LAB_0011500e;
      }
      ppuStack_220 = (undefined **)
                     local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
      local_1d8 = (undefined8 *)0x0;
      local_1d0 = (undefined ***)0x0;
      local_1e8 = (undefined **)0x0;
      pvStack_1e0 = (void *)0x0;
      local_1c0 = (void *)0x0;
      uStack_1b8 = 0;
      local_1b0 = 0;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
      construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                 &local_1e8,&local_298);
      local_2d0 = (void *)0x0;
      uStack_2c8 = 0;
      local_2e8 = local_2b8;
      pvStack_2e0 = local_2b0;
      if (-1 < (long)local_2b0 || local_2b8 == (undefined **)0x0) {
        local_250 = (void *)0x0;
        uStack_248 = 0;
        local_268 = local_2a8;
        pcStack_260 = (char *)local_2a0;
        if (-1 < (long)local_2a0 || local_2a8 == (undefined **)0x0) {
          mnf::Manifold::applyTransport(local_90,&local_238,&local_1e8,&local_2e8,&local_268);
          free(local_250);
          free(local_2d0);
          free(local_1c0);
          local_a0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
          ;
          local_98 = "";
          local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0xbb);
          local_1f0 = 1e-12;
          bVar1 = Eigen::internal::
                  isApprox_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
                  ::run(&local_280,&local_308,&local_1f0);
          local_2e8 = (undefined **)CONCAT71(local_2e8._1_7_,bVar1);
          pvStack_2e0 = (void *)0x0;
          local_2d8.pi_ = (sp_counted_base *)0x0;
          local_268 = (undefined **)0x121550;
          pcStack_260 = "";
          pvStack_1e0 = (void *)((ulong)pvStack_1e0 & 0xffffffffffffff00);
          local_1e8 = &PTR__lazy_ostream_0012bc88;
          local_1d8 = &boost::unit_test::lazy_ostream::inst;
          local_c0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
          ;
          local_b8 = "";
          local_1d0 = &local_268;
          boost::test_tools::tt_detail::report_assertion();
          boost::detail::shared_count::~shared_count(&local_2d8);
          free(local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          free(local_2b8);
          free(local_2a8);
          free(local_308.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          free(local_298);
          local_90[0] = std::terminate;
          free(local_28);
          free(local_38);
          mnf::Manifold::~Manifold((Manifold *)local_90);
          return;
        }
      }
    }
    uStack_2c8 = 0;
    local_2d0 = (void *)0x0;
    __function = 
    "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
    ;
  }
LAB_0011500e:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,__function);
}

Assistant:

BOOST_AUTO_TEST_CASE(RealTransport)
{
  int c = 5;
  RealSpace Space(7);
  Index dim = Space.dim();
  Eigen::MatrixXd H = Eigen::MatrixXd::Random(dim, c);
  Eigen::MatrixXd Hout(dim, c);
  Eigen::VectorXd v = Eigen::VectorXd::Random(dim);
  Eigen::VectorXd x = Space.getZero().value();
  Space.retractation(x, x, v);
  Eigen::MatrixXd expectedRes = H;
  Space.applyTransport(Hout, H, x, v);
  BOOST_CHECK(expectedRes.isApprox(Hout));
}